

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O1

void Assimp::FBX::ResolveVertexDataArray<aiColor4t<float>>
               (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *data_out,Scope *source
               ,string *MappingInformationType,string *ReferenceInformationType,
               char *dataElementName,char *indexDataElementName,size_t vertex_count,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_counts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mapping_offsets,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *mappings)

{
  pointer paVar1;
  pointer pcVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  pointer paVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Scope *pSVar13;
  char *pcVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  Element *pEVar18;
  long lVar19;
  pointer piVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tempData_1;
  vector<int,_std::allocator<int>_> uvIndices;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_229;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  Scope *local_1e8;
  char *local_1e0;
  char *local_1d8;
  string *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = dataElementName;
  iVar16 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1d0 = ReferenceInformationType;
  iVar17 = std::__cxx11::string::compare((char *)ReferenceInformationType);
  local_1e8 = source;
  local_1d8 = indexDataElementName;
  if (iVar17 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,indexDataElementName,&local_229);
    bVar15 = HasElement(source,&local_1c8);
    bVar15 = !bVar15;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar15 = false;
  }
  bVar9 = (bool)(iVar16 == 0 | bVar15);
  iVar16 = std::__cxx11::string::compare((char *)MappingInformationType);
  pcVar14 = local_1e0;
  if ((bVar9) && (iVar16 == 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_1e0,(allocator<char> *)&local_258);
    pSVar13 = local_1e8;
    bVar15 = HasElement(local_1e8,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (!bVar15) {
      return;
    }
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
    local_258.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,pcVar14,(allocator<char> *)&local_228);
    pEVar18 = GetRequiredElement(pSVar13,(string *)local_1a8,(Element *)0x0);
    ParseVectorDataArray
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_258,pEVar18);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(data_out,vertex_count)
    ;
    _Var7._M_p = local_258._M_dataplus._M_p;
    uVar4 = local_258.field_2._M_allocated_capacity;
    if (local_258._M_string_length - (long)local_258._M_dataplus._M_p != 0) {
      lVar19 = (long)(local_258._M_string_length - (long)local_258._M_dataplus._M_p) >> 4;
      lVar21 = 0;
      do {
        uVar3 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start[lVar21];
        uVar22 = (ulong)uVar3;
        uVar23 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar21] + uVar3;
        if (uVar3 < uVar23) {
          do {
            uVar5 = *(undefined8 *)(local_258._M_dataplus._M_p + lVar21 * 0x10);
            uVar6 = *(undefined8 *)(local_258._M_dataplus._M_p + lVar21 * 0x10 + 8);
            paVar8 = (data_out->
                     super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start +
                     (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar22];
            paVar8->r = (float)(int)uVar5;
            paVar8->g = (float)(int)((ulong)uVar5 >> 0x20);
            paVar8->b = (float)(int)uVar6;
            paVar8->a = (float)(int)((ulong)uVar6 >> 0x20);
            uVar22 = uVar22 + 1;
          } while (uVar23 != uVar22);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar19 + (ulong)(lVar19 == 0));
    }
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)MappingInformationType);
    if ((iVar17 != 0 || bVar15) || (iVar16 != 0)) {
      iVar16 = std::__cxx11::string::compare((char *)MappingInformationType);
      pcVar14 = local_1e0;
      pSVar13 = local_1e8;
      if (bVar9 && iVar16 == 0) {
        local_258._M_dataplus._M_p = (pointer)0x0;
        local_258._M_string_length = 0;
        local_258.field_2._M_allocated_capacity = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,local_1e0,(allocator<char> *)&local_228);
        pEVar18 = GetRequiredElement(pSVar13,(string *)local_1a8,(Element *)0x0);
        ParseVectorDataArray
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&local_258,
                   pEVar18);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((long)(local_258._M_string_length - (long)local_258._M_dataplus._M_p) >> 4 ==
            vertex_count) {
          _Var7._M_p = (pointer)(data_out->
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
          paVar8 = (data_out->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish;
          uVar4 = (data_out->
                  super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_start = (pointer)local_258._M_dataplus._M_p;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_258._M_string_length;
          (data_out->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_258.field_2._M_allocated_capacity;
          local_258._M_dataplus._M_p = _Var7._M_p;
          local_258._M_string_length = (size_type)paVar8;
          local_258.field_2._M_allocated_capacity = uVar4;
        }
        else {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[56]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_1a8,
                     (char (*) [56])"length of input data unexpected for ByPolygon mapping: ");
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", expected ",0xb)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          _Var7._M_p = local_258._M_dataplus._M_p;
          uVar4 = local_258.field_2._M_allocated_capacity;
        }
        goto joined_r0x00610141;
      }
      iVar16 = std::__cxx11::string::compare((char *)MappingInformationType);
      if ((iVar17 != 0 || bVar15) || iVar16 != 0) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[60]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [60])"ignoring vertex data channel, access type not implemented: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(MappingInformationType->_M_dataplus)._M_p,
                   MappingInformationType->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(local_1d0->_M_dataplus)._M_p,local_1d0->_M_string_length);
        LogFunctions<Assimp::FBXImporter>::LogError((format *)local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar14,(allocator<char> *)&local_258);
      pEVar18 = GetRequiredElement(pSVar13,(string *)local_1a8,(Element *)0x0);
      pcVar14 = local_1d8;
      ParseVectorDataArray(&local_228,pEVar18);
      pcVar2 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar14,(allocator<char> *)&local_258);
      pEVar18 = GetRequiredElement(pSVar13,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar18);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == vertex_count) {
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start !=
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          uVar22 = 0;
          piVar20 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar24 = (ulong)*piVar20;
            if (uVar24 == 0xffffffffffffffff) {
              paVar8 = (data_out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar22;
              paVar8->r = 0.0;
              paVar8->g = 0.0;
              paVar8->b = 0.0;
              paVar8->a = 0.0;
            }
            else {
              if ((ulong)((long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar24) {
                local_1a8._0_8_ = pcVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar14,&local_259);
                pEVar18 = GetRequiredElement(pSVar13,&local_258,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar18);
              }
              paVar8 = local_228.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar24;
              fVar10 = paVar8->g;
              fVar11 = paVar8->b;
              fVar12 = paVar8->a;
              paVar1 = (data_out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar22;
              paVar1->r = paVar8->r;
              paVar1->g = fVar10;
              paVar1->b = fVar11;
              paVar1->a = fVar12;
            }
            uVar22 = (ulong)((int)uVar22 + 1);
            piVar20 = piVar20 + 1;
          } while (piVar20 !=
                   local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
      }
      else {
        LogFunctions<Assimp::FBXImporter>::LogError((char *)0x610501);
      }
    }
    else {
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,local_1e0,(allocator<char> *)&local_258);
      pSVar13 = local_1e8;
      pEVar18 = GetRequiredElement(local_1e8,(string *)local_1a8,(Element *)0x0);
      pcVar14 = local_1d8;
      ParseVectorDataArray(&local_228,pEVar18);
      pcVar2 = local_1a8 + 0x10;
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
                (data_out,vertex_count);
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (int *)0x0;
      local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar14,(allocator<char> *)&local_258);
      pEVar18 = GetRequiredElement(pSVar13,(string *)local_1a8,(Element *)0x0);
      ParseVectorDataArray(&local_208,pEVar18);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar19 = (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
        lVar21 = 0;
        do {
          uVar3 = (mapping_offsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar21];
          uVar22 = (ulong)uVar3;
          uVar23 = (mapping_counts->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                   ._M_impl.super__Vector_impl_data._M_start[lVar21] + uVar3;
          if (uVar3 < uVar23) {
            do {
              if ((ulong)((long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_228.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                  (ulong)(long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar21]) {
                local_1a8._0_8_ = pcVar2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1a8,"index out of range","");
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_258,pcVar14,&local_259);
                pEVar18 = GetRequiredElement(pSVar13,&local_258,(Element *)0x0);
                Util::DOMError((string *)local_1a8,pEVar18);
              }
              paVar8 = local_228.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start +
                       local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar21];
              fVar10 = paVar8->g;
              fVar11 = paVar8->b;
              fVar12 = paVar8->a;
              paVar1 = (data_out->
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start +
                       (mappings->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar22];
              paVar1->r = paVar8->r;
              paVar1->g = fVar10;
              paVar1->b = fVar11;
              paVar1->a = fVar12;
              uVar22 = uVar22 + 1;
            } while (uVar23 != uVar22);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != lVar19 + (ulong)(lVar19 == 0));
      }
    }
    _Var7._M_p = (pointer)local_228.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start;
    uVar4 = local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var7._M_p = (pointer)local_228.
                            super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = local_228.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    }
  }
joined_r0x00610141:
  if ((pointer)_Var7._M_p != (pointer)0x0) {
    operator_delete(_Var7._M_p,uVar4 - (long)_Var7._M_p);
  }
  return;
}

Assistant:

void ResolveVertexDataArray(std::vector<T>& data_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType,
    const char* dataElementName,
    const char* indexDataElementName,
    size_t vertex_count,
    const std::vector<unsigned int>& mapping_counts,
    const std::vector<unsigned int>& mapping_offsets,
    const std::vector<unsigned int>& mappings)
{
    bool isDirect = ReferenceInformationType == "Direct";
    bool isIndexToDirect = ReferenceInformationType == "IndexToDirect";

    // fall-back to direct data if there is no index data element
    if ( isIndexToDirect && !HasElement( source, indexDataElementName ) ) {
        isDirect = true;
        isIndexToDirect = false;
    }

    // handle permutations of Mapping and Reference type - it would be nice to
    // deal with this more elegantly and with less redundancy, but right
    // now it seems unavoidable.
    if (MappingInformationType == "ByVertice" && isDirect) {
        if (!HasElement(source, dataElementName)) {
            return;
        }
        std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);
		for (size_t i = 0, e = tempData.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				data_out[mappings[j]] = tempData[i];
            }
        }
    }
    else if (MappingInformationType == "ByVertice" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));
        for (size_t i = 0, e = uvIndices.size(); i < e; ++i) {

            const unsigned int istart = mapping_offsets[i], iend = istart + mapping_counts[i];
            for (unsigned int j = istart; j < iend; ++j) {
				if (static_cast<size_t>(uvIndices[i]) >= tempData.size()) {
                    DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
                }
				data_out[mappings[j]] = tempData[uvIndices[i]];
            }
        }
    }
    else if (MappingInformationType == "ByPolygonVertex" && isDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

		if (tempData.size() != vertex_count) {
            FBXImporter::LogError(Formatter::format("length of input data unexpected for ByPolygon mapping: ")
				<< tempData.size() << ", expected " << vertex_count
            );
            return;
        }

		data_out.swap(tempData);
    }
    else if (MappingInformationType == "ByPolygonVertex" && isIndexToDirect) {
		std::vector<T> tempData;
		ParseVectorDataArray(tempData, GetRequiredElement(source, dataElementName));

        data_out.resize(vertex_count);

        std::vector<int> uvIndices;
        ParseVectorDataArray(uvIndices,GetRequiredElement(source,indexDataElementName));

        if (uvIndices.size() != vertex_count) {
            FBXImporter::LogError("length of input data unexpected for ByPolygonVertex mapping");
            return;
        }

        const T empty;
        unsigned int next = 0;
        for(int i : uvIndices) {
            if ( -1 == i ) {
                data_out[ next++ ] = empty;
                continue;
            }
            if (static_cast<size_t>(i) >= tempData.size()) {
                DOMError("index out of range",&GetRequiredElement(source,indexDataElementName));
            }

			data_out[next++] = tempData[i];
        }
    }
    else {
        FBXImporter::LogError(Formatter::format("ignoring vertex data channel, access type not implemented: ")
            << MappingInformationType << "," << ReferenceInformationType);
    }
}